

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::EvaluateElementStrainEnergy
          (ChElementBeamTaperedTimoshenko *this,ChVector<double> *StrainEnergyV_trans,
          ChVector<double> *StrainEnergyV_rot)

{
  double dVar1;
  double dVar2;
  Scalar *pSVar3;
  Scalar *pSVar4;
  long lVar5;
  int i;
  long index;
  bool bVar6;
  ChVectorDynamic<> displ;
  ChVectorN<double,_6> strain_energy_v;
  ChVectorN<double,_12> strain_energy;
  Matrix<double,__1,_1,_0,__1,_1> local_1a8;
  Matrix<double,__1,_1,_0,__1,_1> *local_198;
  Scalar local_190;
  Product<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_188;
  Product<Eigen::DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>
  local_140;
  DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_f8;
  int local_c0 [36];
  
  local_c0[0] = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
                  _vptr_ChElementBase[3])();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_1a8,local_c0);
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[6])
            (this,&local_1a8);
  local_190 = 0.5;
  local_198 = &local_1a8;
  Eigen::operator*(&local_f8,&local_190,
                   (DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)&local_198);
  Eigen::
  Product<Eigen::DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>
  ::Product(&local_140,&local_f8,&this->Km);
  Eigen::
  Product<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>
  ::Product(&local_188,&local_140,&local_1a8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Product<Eigen::DiagonalWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,Eigen::Matrix<double,_1,_1,1,_1,_1>,1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_c0,
             (DenseBase<Eigen::Product<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)&local_188);
  lVar5 = 6;
  index = 0;
  while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1> *)local_c0,index
                       );
    dVar1 = *pSVar3;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1> *)local_c0,
                        index + 6);
    dVar2 = *pSVar3;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&local_140,index
                       );
    index = index + 1;
    *pSVar4 = dVar2 + dVar1;
  }
  Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)&local_188,
             (Matrix<double,_6,_1,_0,_6,_1> *)&local_140,0,3);
  ChVector<double>::operator=
            (StrainEnergyV_trans,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
             &local_188);
  Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)&local_188,
             (Matrix<double,_6,_1,_0,_6,_1> *)&local_140,3,3);
  ChVector<double>::operator=
            (StrainEnergyV_rot,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
             &local_188);
  Eigen::internal::handmade_aligned_free
            (local_1a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
  return;
}

Assistant:

void ChElementBeamTaperedTimoshenko::EvaluateElementStrainEnergy(ChVector<>& StrainEnergyV_trans,
                                                                 ChVector<>& StrainEnergyV_rot) {
    ChVectorDynamic<> displ(this->GetNdofs());
    this->GetStateBlock(displ);

    ChVectorN<double, 12> strain_energy = 1.0 / 2.0 * displ.asDiagonal() * this->Km * displ;
    ChVectorN<double, 6> strain_energy_v;
    // double strain_energy_sum = 0;
    for (int i = 0; i < 6; i++) {
        strain_energy_v(i) = strain_energy(i) + strain_energy(i + 6);
        // strain_energy_sum += strain_energy_v(i);
    }

    StrainEnergyV_trans = strain_energy_v.segment(0, 3);
    StrainEnergyV_rot = strain_energy_v.segment(3, 3);
}